

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool EvBoxSideTextureCoordinateHelper1
               (ON_Mesh *mesh,ON_Xform *mesh_xform,int vi,int side,ON_TextureMapping *box_mapping,
               float *Tx,float *Ty)

{
  bool bVar1;
  ON_3fPoint *pOVar2;
  double dVar3;
  double local_1c8;
  double local_1c0;
  ON_3fVector *local_1b8;
  double w;
  float *f;
  double *NT;
  double *PT;
  ON_Xform N_xform;
  ON_Xform P_xform;
  ON_3fVector *mesh_N;
  ON_3fPoint *mesh_V;
  ON_3dVector N;
  ON_3dPoint tc;
  ON_3dPoint P;
  bool rc;
  float *Tx_local;
  ON_TextureMapping *box_mapping_local;
  int side_local;
  int vi_local;
  ON_Xform *mesh_xform_local;
  ON_Mesh *mesh_local;
  
  ON_3dVector::ON_3dVector((ON_3dVector *)&mesh_V,0.0,0.0,0.0);
  pOVar2 = ON_SimpleArray<ON_3fPoint>::Array(&(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
  bVar1 = ON_Mesh::HasVertexNormals(mesh);
  if (bVar1) {
    local_1b8 = ON_SimpleArray<ON_3fVector>::Array(&(mesh->m_N).super_ON_SimpleArray<ON_3fVector>);
  }
  else {
    local_1b8 = (ON_3fVector *)0x0;
  }
  memcpy(N_xform.m_xform[3] + 3,&ON_Xform::IdentityTransformation,0x80);
  memcpy(&PT,&ON_Xform::IdentityTransformation,0x80);
  NT = (double *)0x0;
  f = (float *)0x0;
  if (((mesh_xform != (ON_Xform *)0x0) && (bVar1 = ON_Xform::IsZero(mesh_xform), !bVar1)) &&
     (bVar1 = ON_Xform::IsIdentity(mesh_xform,0.0), !bVar1)) {
    dVar3 = ON_Xform::GetMappingXforms
                      (mesh_xform,(ON_Xform *)(N_xform.m_xform[3] + 3),(ON_Xform *)&PT);
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      NT = ON_Xform::operator[]((ON_Xform *)(N_xform.m_xform[3] + 3),0);
      f = (float *)ON_Xform::operator[]((ON_Xform *)&PT,0);
    }
  }
  if ((local_1b8 == (ON_3fVector *)0x0) || (box_mapping->m_projection != ray_projection)) {
    if (NT == (double *)0x0) {
      ON_3dPoint::operator=((ON_3dPoint *)&tc.z,pOVar2 + vi);
    }
    else {
      pOVar2 = pOVar2 + vi;
      local_1c8 = NT[0xe] * (double)pOVar2->z +
                  NT[0xc] * (double)pOVar2->x + NT[0xd] * (double)pOVar2->y + NT[0xf];
      if ((local_1c8 != 0.0) || (NAN(local_1c8))) {
        local_1c8 = 1.0 / local_1c8;
      }
      else {
        local_1c8 = 1.0;
      }
      tc.z = local_1c8 *
             (NT[2] * (double)pOVar2->z + *NT * (double)pOVar2->x + NT[1] * (double)pOVar2->y +
             NT[3]);
    }
  }
  else if ((NT == (double *)0x0) || (f == (float *)0x0)) {
    ON_3dPoint::operator=((ON_3dPoint *)&tc.z,pOVar2 + vi);
    ON_3dVector::operator=((ON_3dVector *)&mesh_V,local_1b8 + vi);
  }
  else {
    pOVar2 = pOVar2 + vi;
    local_1c0 = NT[0xe] * (double)pOVar2->z +
                NT[0xc] * (double)pOVar2->x + NT[0xd] * (double)pOVar2->y + NT[0xf];
    if ((local_1c0 != 0.0) || (NAN(local_1c0))) {
      local_1c0 = 1.0 / local_1c0;
    }
    else {
      local_1c0 = 1.0;
    }
    tc.z = local_1c0 *
           (NT[2] * (double)pOVar2->z + *NT * (double)pOVar2->x + NT[1] * (double)pOVar2->y + NT[3])
    ;
    local_1b8 = local_1b8 + vi;
    mesh_V = (ON_3fPoint *)
             (NT[2] * (double)local_1b8->z +
             *NT * (double)local_1b8->x + NT[1] * (double)local_1b8->y);
    N.x = NT[6] * (double)local_1b8->z + NT[4] * (double)local_1b8->x + NT[5] * (double)local_1b8->y
    ;
    N.y = NT[10] * (double)local_1b8->z +
          NT[8] * (double)local_1b8->x + NT[9] * (double)local_1b8->y;
    ON_3dVector::Unitize((ON_3dVector *)&mesh_V);
  }
  P.z._7_1_ = EvBoxSideTextureCoordinateHelper2
                        (side,box_mapping,(ON_3dPoint *)&tc.z,(ON_3dVector *)&mesh_V,
                         (ON_3dPoint *)&N.z);
  if ((P.z._7_1_) && (P.z._7_1_ = ON_3dPoint::IsValid((ON_3dPoint *)&N.z), P.z._7_1_)) {
    *Tx = (float)N.z;
    *Ty = (float)tc.x;
  }
  return P.z._7_1_;
}

Assistant:

static
bool EvBoxSideTextureCoordinateHelper1(
          const ON_Mesh& mesh,
          const ON_Xform* mesh_xform,
          int vi,
          int side,
          const ON_TextureMapping& box_mapping,
          float* Tx,
          float* Ty
          )
{
	bool rc = false;
  ON_3dPoint  P, tc;
	ON_3dVector N(0.0,0.0,0.0);

	const ON_3fPoint*  mesh_V = mesh.m_V.Array();
	const ON_3fVector* mesh_N = mesh.HasVertexNormals()
                            ? mesh.m_N.Array()
                            : 0;

  ON_Xform P_xform(ON_Xform::IdentityTransformation), N_xform(ON_Xform::IdentityTransformation);
  const double* PT = 0;
  const double* NT = 0;
  if ( mesh_xform )
  {
    if ( mesh_xform->IsZero() || mesh_xform->IsIdentity() )
    {
      // ignore transformation
      mesh_xform = 0;
    }
    else if ( 0.0 != mesh_xform->GetMappingXforms(P_xform,N_xform) )
    {
      PT = &P_xform[0][0];
      NT = &N_xform[0][0];
    }
    else
    {
      mesh_xform = 0;
    }
  }

  const float* f;
  double w;

  if ( mesh_N && ON_TextureMapping::PROJECTION::ray_projection == box_mapping.m_projection )
	{
		// calculation uses mesh vertex normal
    if ( PT && NT )
    {
      // need to transform vertex and normal
      // before calculating texture coordinates
      f = &mesh_V[vi].x;
		  w = PT[12]*f[0] + PT[13]*f[1] + PT[14]*f[2] + PT[15];
      w = (0.0 != w) ? 1.0/w : 1.0;
		  P.x = w*(PT[0]*f[0] + PT[1]*f[1] + PT[ 2]*f[2] + PT[ 3]);
		  P.y = w*(PT[4]*f[0] + PT[5]*f[1] + PT[ 6]*f[2] + PT[ 7]);
		  P.z = w*(PT[8]*f[0] + PT[9]*f[1] + PT[10]*f[2] + PT[11]);

      f = &mesh_N[vi].x;
      N.x = PT[0]*f[0] + PT[1]*f[1] + PT[ 2]*f[2];
		  N.y = PT[4]*f[0] + PT[5]*f[1] + PT[ 6]*f[2];
		  N.z = PT[8]*f[0] + PT[9]*f[1] + PT[10]*f[2];
      N.Unitize();
    }
    else
    {
      // mesh vertex and normal are ok
		  P = mesh_V[vi];
		  N = mesh_N[vi];
    }
	}
	else if ( PT )
  {
    // normal is not used
    // mesh vertex needs to be transformed
    f = &mesh_V[vi].x;
	  w = PT[12]*f[0] + PT[13]*f[1] + PT[14]*f[2] + PT[15];
    w = (0.0 != w) ? 1.0/w : 1.0;
	  P.x = w*(PT[0]*f[0] + PT[1]*f[1] + PT[ 2]*f[2] + PT[ 3]);
	  P.y = w*(PT[4]*f[0] + PT[5]*f[1] + PT[ 6]*f[2] + PT[ 7]);
	  P.z = w*(PT[8]*f[0] + PT[9]*f[1] + PT[10]*f[2] + PT[11]);
  }
  else
  {
    // normal is not used and mesh vertex is ok
    P = mesh_V[vi];
  }


  rc = EvBoxSideTextureCoordinateHelper2(side,box_mapping,P,N,&tc);
  if (rc)
  {
    rc = tc.IsValid();
    if (rc)
    {
      *Tx = (float)tc.x;
      *Ty = (float)tc.y;
    }
  }
	return rc;
}